

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form1_ProjectionProfile(ProjectionProfileForm1 ProjectionProfile)

{
  anon_class_8_1_a8c68091 __pred;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  int iVar1;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  code *in_RDI;
  uint32_t value;
  vector<unsigned_int,_std::allocator<unsigned_int>_> projection;
  bool horizontal;
  Image image;
  uint8_t intensity;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff08;
  uint8_t in_stack_ffffffffffffff16;
  uint8_t in_stack_ffffffffffffff17;
  undefined8 in_stack_ffffffffffffff18;
  undefined2 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff22;
  undefined1 in_stack_ffffffffffffff23;
  byte bVar2;
  uint32_t in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  uint32_t uVar3;
  uint32_t in_stack_ffffffffffffff2c;
  undefined8 in_stack_ffffffffffffff30;
  uint32_t in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  uint8_t value_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  byte local_6d;
  ImageTemplate<unsigned_char> local_38;
  uint8_t local_9;
  code *local_8;
  
  value_00 = (uint8_t)((uint)in_stack_ffffffffffffff3c >> 0x18);
  uVar3 = (uint32_t)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  local_8 = in_RDI;
  local_9 = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff24,
                      CONCAT13(in_stack_ffffffffffffff23,
                               CONCAT12(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20))),
             (uint32_t)((ulong)in_stack_ffffffffffffff18 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff18,in_stack_ffffffffffffff17,in_stack_ffffffffffffff16
            );
  Test_Helper::uniformImage
            (value_00,in_stack_ffffffffffffff38,uVar3,
             (Image *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1de575);
  iVar1 = Test_Helper::randomValue<int>(0x1de57f);
  local_6d = iVar1 == 0;
  (*local_8)(&local_88,&local_38,local_6d);
  if ((local_6d & 1) == 0) {
    PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_38);
  }
  else {
    PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_38);
  }
  __first._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_88);
  if ((local_6d & 1) == 0) {
    in_stack_ffffffffffffff24 = PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_38);
    uVar3 = in_stack_ffffffffffffff24;
  }
  else {
    in_stack_ffffffffffffff2c = PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_38);
    uVar3 = in_stack_ffffffffffffff2c;
  }
  bVar2 = false;
  if (__first._M_current == (uint *)(ulong)uVar3) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(in_stack_ffffffffffffff08);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_ffffffffffffff08);
    __last._M_current._4_4_ = in_stack_ffffffffffffff2c;
    __last._M_current._0_4_ = uVar3;
    __pred.value._2_1_ = in_stack_ffffffffffffff22;
    __pred.value._0_2_ = in_stack_ffffffffffffff20;
    __pred.value._3_1_ = bVar2;
    __pred.value._4_4_ = in_stack_ffffffffffffff24;
    in_stack_ffffffffffffff22 =
         std::
         all_of<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,Function_Template::form1_ProjectionProfile(std::vector<unsigned_int,std::allocator<unsigned_int>>(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,bool))::__0>
                   (__first,__last,__pred);
    bVar2 = in_stack_ffffffffffffff22;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff24,
                      CONCAT13(bVar2,CONCAT12(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)))
            );
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1de6e9);
  return (bool)(bVar2 & 1);
}

Assistant:

bool form1_ProjectionProfile(ProjectionProfileForm1 ProjectionProfile)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image image = uniformImage( intensity );

        const bool horizontal = (randomValue<int>(2) == 0);

        std::vector < uint32_t > projection = ProjectionProfile( image, horizontal );

        const uint32_t value = (horizontal ? image.height() : image.width()) * intensity;

        return projection.size() == (horizontal ? image.width() : image.height()) &&
            std::all_of( projection.begin(), projection.end(), [&value]( uint32_t v ) { return value == v; } );
    }